

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcDrawBuffersIndexedBase.cpp
# Opt level: O2

void __thiscall
glcts::DrawBuffersIndexedBase::BlendMaskStateMachine::SetColorMask
          (BlendMaskStateMachine *this,GLboolean r,GLboolean g,GLboolean b,GLboolean a)

{
  pointer pBVar1;
  pointer pBVar2;
  uint uVar3;
  ulong uVar4;
  
  (*this->gl->colorMask)(r,g,b,a);
  pBVar1 = (this->state).
           super__Vector_base<glcts::DrawBuffersIndexedBase::BlendMaskState,_std::allocator<glcts::DrawBuffersIndexedBase::BlendMaskState>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pBVar2 = (this->state).
           super__Vector_base<glcts::DrawBuffersIndexedBase::BlendMaskState,_std::allocator<glcts::DrawBuffersIndexedBase::BlendMaskState>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (uVar3 = 0; uVar4 = (ulong)uVar3, uVar4 < (ulong)((long)pBVar2 - (long)pBVar1 >> 5);
      uVar3 = uVar3 + 1) {
    pBVar1[uVar4].mask_r = r;
    pBVar1[uVar4].mask_g = g;
    pBVar1[uVar4].mask_b = b;
    pBVar1[uVar4].mask_a = a;
  }
  return;
}

Assistant:

void DrawBuffersIndexedBase::BlendMaskStateMachine::SetColorMask(glw::GLboolean r, glw::GLboolean g, glw::GLboolean b,
																 glw::GLboolean a)
{
	// all draw buffers
	gl.colorMask(r, g, b, a);
	for (unsigned int i = 0; i < state.size(); ++i)
	{
		state[i].mask_r = r;
		state[i].mask_g = g;
		state[i].mask_b = b;
		state[i].mask_a = a;
	}
}